

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,string *name)

{
  string *in_RSI;
  long in_RDI;
  
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::vector
            ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)0x19b2fd);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)0x19b30f);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)0x19b322);
  std::__cxx11::string::string((string *)(in_RDI + 0x48),in_RSI);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}